

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_11f14fc::IFFT2DTest_Correctness_Test::TestBody(IFFT2DTest_Correctness_Test *this)

{
  bool bVar1;
  ParamType *pPVar2;
  vector<float,_std::allocator<float>_> *this_00;
  allocator_type *__a;
  reference pvVar3;
  reference pvVar4;
  long in_RDI;
  float fVar5;
  AssertionResult gtest_ar_1;
  int xx;
  int yy;
  int i;
  vector<std::complex<float>,_std::allocator<std::complex<float>_>_> input_c;
  int x;
  int y;
  vector<float,_std::allocator<float>_> actual;
  char *in_stack_000000b8;
  vector<float,_std::allocator<float>_> expected;
  AssertionResult gtest_ar;
  int n;
  AssertHelper *in_stack_fffffffffffffee0;
  int *in_stack_fffffffffffffee8;
  vector<float,_std::allocator<float>_> *this_01;
  allocator_type *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  undefined1 *__n;
  char *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  Type type;
  undefined1 *puVar6;
  AssertHelper *in_stack_ffffffffffffff10;
  AssertionResult local_d0;
  int local_bc;
  int local_b8;
  int local_b4;
  int in_stack_ffffffffffffff54;
  pointer in_stack_ffffffffffffff58;
  pointer in_stack_ffffffffffffff60;
  int local_94;
  int local_90;
  undefined1 local_89 [32];
  undefined1 local_69;
  vector<float,_std::allocator<float>_> local_68;
  uint local_4c;
  undefined4 local_24;
  AssertionResult local_20;
  int local_c;
  
  type = (Type)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  pPVar2 = testing::WithParamInterface<(anonymous_namespace)::IFFTTestArg>::GetParam();
  local_c = pPVar2->n;
  local_24 = 2;
  testing::internal::CmpHelperGE<int,int>
            (in_stack_fffffffffffffef8,(char *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             (int *)in_stack_fffffffffffffee0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff10);
    in_stack_ffffffffffffff10 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xb3ce14);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff10,type,in_stack_ffffffffffffff00,
               (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),(char *)in_stack_fffffffffffffef0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffff60,(Message *)in_stack_ffffffffffffff58);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffee0);
    testing::Message::~Message((Message *)0xb3ce71);
  }
  local_4c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb3cef8);
  if (local_4c == 0) {
    this_00 = (vector<float,_std::allocator<float>_> *)(ulong)(uint)(local_c * local_c);
    puVar6 = &local_69;
    std::allocator<float>::allocator((allocator<float> *)0xb3cf2b);
    std::vector<float,_std::allocator<float>_>::vector
              (this_00,(size_type)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    std::allocator<float>::~allocator((allocator<float> *)0xb3cf51);
    __a = (allocator_type *)(ulong)(uint)(local_c * local_c);
    __n = local_89;
    std::allocator<float>::allocator((allocator<float> *)0xb3cf72);
    std::vector<float,_std::allocator<float>_>::vector(this_00,(size_type)__n,__a);
    std::allocator<float>::~allocator((allocator<float> *)0xb3cf98);
    for (local_90 = 0; local_90 < local_c; local_90 = local_90 + 1) {
      for (local_94 = 0; local_94 < local_c; local_94 = local_94 + 1) {
        this_01 = &local_68;
        pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                           (this_01,(long)(local_90 * local_c + local_94));
        *pvVar3 = 1.0;
        std::vector<float,_std::allocator<float>_>::operator[](this_01,0);
        fft2d<float>((float *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
        for (local_b4 = 0; local_b4 < local_c * local_c; local_b4 = local_b4 + 1) {
          pvVar4 = std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::
                   operator[]((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                              &stack0xffffffffffffff50,(long)local_b4);
          fVar5 = std::complex<float>::real_abi_cxx11_(pvVar4);
          *(float *)(*(long *)(in_RDI + 0x18) + (long)(local_b4 << 1) * 4) = fVar5;
          pvVar4 = std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::
                   operator[]((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                              &stack0xffffffffffffff50,(long)local_b4);
          fVar5 = std::complex<float>::imag_abi_cxx11_(pvVar4);
          *(float *)(*(long *)(in_RDI + 0x18) + (long)(local_b4 * 2 + 1) * 4) = fVar5;
        }
        pPVar2 = testing::WithParamInterface<(anonymous_namespace)::IFFTTestArg>::GetParam();
        (*pPVar2->ifft)(*(float **)(in_RDI + 0x18),*(float **)(in_RDI + 0x20),
                        *(float **)(in_RDI + 0x28));
        for (local_b8 = 0; local_b8 < local_c; local_b8 = local_b8 + 1) {
          for (local_bc = 0; local_bc < local_c; local_bc = local_bc + 1) {
            std::vector<float,_std::allocator<float>_>::operator[]
                      (&local_68,(long)(local_b8 * local_c + local_bc));
            testing::internal::DoubleNearPredFormat
                      ((char *)expected.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_finish,
                       (char *)expected.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start,in_stack_000000b8,
                       (double)actual.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,
                       (double)actual.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_finish,
                       (double)actual.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d0);
            if (!bVar1) {
              testing::Message::Message((Message *)in_stack_ffffffffffffff10);
              testing::AssertionResult::failure_message((AssertionResult *)0xb3d267);
              testing::internal::AssertHelper::AssertHelper
                        (in_stack_ffffffffffffff10,(Type)((ulong)puVar6 >> 0x20),(char *)this_00,
                         (int)((ulong)__n >> 0x20),(char *)__a);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)in_stack_ffffffffffffff60,
                         (Message *)in_stack_ffffffffffffff58);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)pPVar2);
              testing::Message::~Message((Message *)0xb3d2b3);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)0xb3d315);
          }
        }
        pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                           (&local_68,(long)(local_90 * local_c + local_94));
        *pvVar3 = 0.0;
        std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::~vector
                  ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)__a);
      }
    }
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)__a);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)__a);
  }
  return;
}

Assistant:

TEST_P(IFFT2DTest, Correctness) {
  int n = GetParam().n;
  ASSERT_GE(n, 2);
  std::vector<float> expected(n * n);
  std::vector<float> actual(n * n);
  // Do forward transform then invert to make sure we get back expected
  for (int y = 0; y < n; ++y) {
    for (int x = 0; x < n; ++x) {
      expected[y * n + x] = 1;
      std::vector<std::complex<float> > input_c = fft2d(&expected[0], n);
      for (int i = 0; i < n * n; ++i) {
        input_[2 * i + 0] = input_c[i].real();
        input_[2 * i + 1] = input_c[i].imag();
      }
      GetParam().ifft(&input_[0], &temp_[0], &output_[0]);

      for (int yy = 0; yy < n; ++yy) {
        for (int xx = 0; xx < n; ++xx) {
          EXPECT_NEAR(expected[yy * n + xx], output_[yy * n + xx] / (n * n),
                      1e-5);
        }
      }
      expected[y * n + x] = 0;
    }
  }
}